

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

string * __thiscall
deqp::egl::(anonymous_namespace)::configListToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Library *egl,
          EGLDisplay *display,vector<void_*,_std::allocator<void_*>_> *configs)

{
  bool bVar1;
  reference ppvVar2;
  long lVar3;
  string local_80;
  EGLint local_5c;
  EGLConfig pvStack_58;
  EGLint configId;
  EGLConfig config;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_48;
  const_iterator cfgIter;
  allocator<char> local_2a;
  undefined1 local_29;
  vector<void_*,_std::allocator<void_*>_> *local_28;
  vector<void_*,_std::allocator<void_*>_> *configs_local;
  EGLDisplay *display_local;
  Library *egl_local;
  string *str;
  
  local_29 = 0;
  local_28 = (vector<void_*,_std::allocator<void_*>_> *)display;
  configs_local = (vector<void_*,_std::allocator<void_*>_> *)egl;
  display_local = (EGLDisplay *)this;
  egl_local = (Library *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  local_48._M_current = (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(local_28);
  while( true ) {
    config = (EGLConfig)std::vector<void_*,_std::allocator<void_*>_>::end(local_28);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>
                        *)&config);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&local_48);
    pvStack_58 = *ppvVar2;
    local_5c = eglu::getConfigID((Library *)display_local,
                                 (configs_local->super__Vector_base<void_*,_std::allocator<void_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start,pvStack_58);
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    de::toString<int>(&local_80,&local_5c);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    __gnu_cxx::__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
    operator++(&local_48,0);
  }
  return __return_storage_ptr__;
}

Assistant:

string configListToString (const Library& egl, const EGLDisplay& display, const vector<EGLConfig>& configs)
{
	string str = "";
	for (vector<EGLConfig>::const_iterator cfgIter = configs.begin(); cfgIter != configs.end(); cfgIter++)
	{
		EGLConfig	config		= *cfgIter;
		EGLint		configId	= eglu::getConfigID(egl, display, config);

		if (str.length() != 0)
			str += " ";

		str += de::toString(configId);
	}
	return str;
}